

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedHandler::FlattenedField::FlattenedField
          (FlattenedField *this,StringPtr prefix,StringPtr name,
          OneOf<capnp::StructSchema::Field,_capnp::Type> *type,Reader *value)

{
  size_t sVar1;
  FlattenedField *params_1;
  OneOf<capnp::StructSchema::Field,_capnp::Type> *type_local;
  FlattenedField *this_local;
  StringPtr name_local;
  StringPtr prefix_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  params_1 = (FlattenedField *)name.content.ptr;
  name_local.content.size_ = (size_t)prefix.content.ptr;
  this_local = params_1;
  sVar1 = kj::StringPtr::size((StringPtr *)&name_local.content.size_);
  if (sVar1 == 0) {
    kj::String::String(&this->ownName,(void *)0x0);
  }
  else {
    kj::str<kj::StringPtr&,kj::StringPtr&>
              (&this->ownName,(kj *)&name_local.content.size_,(StringPtr *)&this_local,
               (StringPtr *)params_1);
  }
  sVar1 = kj::StringPtr::size((StringPtr *)&name_local.content.size_);
  if (sVar1 == 0) {
    (this->name).content.ptr = (char *)this_local;
    (this->name).content.size_ = (size_t)name_local.content.ptr;
  }
  else {
    kj::StringPtr::StringPtr(&this->name,&this->ownName);
  }
  kj::OneOf<capnp::StructSchema::Field,_capnp::Type>::OneOf(&this->type,type);
  DynamicValue::Reader::Reader(&this->value,value);
  return;
}

Assistant:

FlattenedField(kj::StringPtr prefix, kj::StringPtr name,
                   kj::OneOf<StructSchema::Field, Type> type, DynamicValue::Reader value)
        : ownName(prefix.size() > 0 ? kj::str(prefix, name) : nullptr),
          name(prefix.size() > 0 ? ownName : name),
          type(type), value(value) {}